

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void compileoptionusedFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  char *zOptName;
  anon_union_8_5_44880d43_for_u aVar2;
  
  zOptName = (char *)sqlite3ValueText(*argv,'\x01');
  if (zOptName != (char *)0x0) {
    uVar1 = sqlite3_compileoption_used(zOptName);
    aVar2.i._4_4_ = 0;
    aVar2.nZero = uVar1;
    sqlite3VdbeMemRelease(&context->s);
    (context->s).u = aVar2;
    (context->s).flags = 4;
    (context->s).type = '\x01';
  }
  return;
}

Assistant:

static void compileoptionusedFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zOptName;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-39564-36305 The sqlite_compileoption_used() SQL
  ** function is a wrapper around the sqlite3_compileoption_used() C/C++
  ** function.
  */
  if( (zOptName = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    sqlite3_result_int(context, sqlite3_compileoption_used(zOptName));
  }
}